

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Entity_State_PDU::Encode(Entity_State_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  VariableParameter *pVVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Entity_State_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EntityID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ForceID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumOfVariableParams);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_AltEntityType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityLinearVelocity).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityLocation).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityOrientation).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityAppearance).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_DeadReckoningParameter).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EntityMarking).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_EntityCapabilities).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
            ::begin(&this->m_vVariableParameters);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
       ::end(&this->m_vVariableParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
              ::operator*(&citrEnd);
    pVVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::operator->(this_00);
    (*(pVVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pVVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Entity_State_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_EntityID
           << m_ui8ForceID
           << m_ui8NumOfVariableParams
           << KDIS_STREAM m_EntityType
           << KDIS_STREAM m_AltEntityType
           << KDIS_STREAM m_EntityLinearVelocity
           << KDIS_STREAM m_EntityLocation
           << KDIS_STREAM m_EntityOrientation
           << KDIS_STREAM m_EntityAppearance
           << KDIS_STREAM m_DeadReckoningParameter
           << KDIS_STREAM m_EntityMarking
           << KDIS_STREAM m_EntityCapabilities;

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ( *citr )->Encode( stream );
    }
}